

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O0

void __thiscall ag::FunctionData::~FunctionData(FunctionData *this)

{
  FunctionData *this_local;
  
  std::__cxx11::string::~string((string *)&this->Name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FunctionData() : Object(""), Name(""), Arguments(0) {}